

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H1V2Convert(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  uint8 uVar3;
  uint uVar4;
  int iVar5;
  long in_RDI;
  int yy;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int j;
  int i;
  uint8 *c;
  uint8 *y;
  uint8 *d1;
  uint8 *d0;
  int row;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  uint8 *local_20;
  uint8 *local_18;
  
  uVar4 = *(int *)(in_RDI + 0x248) - *(int *)(in_RDI + 0x288);
  local_18 = *(uint8 **)(in_RDI + 0x34b8);
  local_20 = *(uint8 **)(in_RDI + 0x34c0);
  if ((int)uVar4 < 8) {
    local_28 = *(long *)(in_RDI + 0x24a8) + (long)(int)(uVar4 * 8);
  }
  else {
    local_28 = *(long *)(in_RDI + 0x24a8) + 0x40 + (long)(int)((uVar4 & 7) << 3);
  }
  local_30 = *(long *)(in_RDI + 0x24a8) + 0x80 + (long)(((int)uVar4 >> 1) << 3);
  for (local_34 = *(int *)(in_RDI + 0x245c); 0 < local_34; local_34 = local_34 + -1) {
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      uVar4 = (uint)*(byte *)(local_30 + (local_38 + 0x40));
      iVar1 = *(int *)(in_RDI + 0x24b8 + (long)(int)uVar4 * 4);
      iVar5 = *(int *)(in_RDI + 0x2cb8 + (long)(int)uVar4 * 4) +
              *(int *)(in_RDI + 0x30b8 + (long)(int)(uint)*(byte *)(local_30 + local_38) * 4) >>
              0x10;
      iVar2 = *(int *)(in_RDI + 0x28b8 + (long)(int)(uint)*(byte *)(local_30 + local_38) * 4);
      uVar4 = (uint)*(byte *)(local_28 + local_38);
      uVar3 = clamp(uVar4 + iVar1);
      *local_18 = uVar3;
      uVar3 = clamp(uVar4 + iVar5);
      local_18[1] = uVar3;
      uVar3 = clamp(uVar4 + iVar2);
      local_18[2] = uVar3;
      local_18[3] = 0xff;
      uVar4 = (uint)*(byte *)(local_28 + (local_38 + 8));
      uVar3 = clamp(uVar4 + iVar1);
      *local_20 = uVar3;
      uVar3 = clamp(uVar4 + iVar5);
      local_20[1] = uVar3;
      uVar3 = clamp(uVar4 + iVar2);
      local_20[2] = uVar3;
      local_20[3] = 0xff;
      local_18 = local_18 + 4;
      local_20 = local_20 + 4;
    }
    local_28 = local_28 + 0x100;
    local_30 = local_30 + 0x100;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 1 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 2 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int j = 0; j < 8; j++)
			{
				int cb = c[0 + j];
				int cr = c[64 + j];

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				int yy = y[j];
				d0[0] = clamp(yy + rc);
				d0[1] = clamp(yy + gc);
				d0[2] = clamp(yy + bc);
				d0[3] = 255;

				yy = y[8 + j];
				d1[0] = clamp(yy + rc);
				d1[1] = clamp(yy + gc);
				d1[2] = clamp(yy + bc);
				d1[3] = 255;

				d0 += 4;
				d1 += 4;
			}

			y += 64 * 4;
			c += 64 * 4;
		}
	}